

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minideen.hpp
# Opt level: O0

DSFrame * __thiscall
MiniDeen::GetFrame(DSFrame *__return_storage_ptr__,MiniDeen *this,int n,
                  unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
                  *in_frames)

{
  int src_stride_00;
  uchar *src_ptr_00;
  bool bVar1;
  mapped_type *old;
  uchar *dst_ptr;
  int dst_stride;
  uchar *src_ptr;
  int src_stride;
  int width;
  int height;
  bool chroma;
  int p;
  undefined1 local_100 [8];
  mapped_type src;
  unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
  *in_frames_local;
  MiniDeen *pMStack_20;
  int n_local;
  MiniDeen *this_local;
  DSFrame *dst;
  
  src.planes = (int *)in_frames;
  in_frames_local._4_4_ = n;
  pMStack_20 = this;
  this_local = (MiniDeen *)__return_storage_ptr__;
  old = std::
        unordered_map<int,_DSFrame,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_DSFrame>_>_>
        ::operator[](in_frames,(key_type *)((long)&in_frames_local + 4));
  DSFrame::DSFrame((DSFrame *)local_100,old);
  if ((this->bypass & 1U) == 0) {
    DSFrame::Create(__return_storage_ptr__,(DSFrame *)local_100,false);
    for (height = 0; height < (this->super_Filter).in_vi.Format.Planes; height = height + 1) {
      bVar1 = false;
      if ((((this->super_Filter).in_vi.Format.IsFamilyYUV & 1U) != 0) && (bVar1 = false, 0 < height)
         ) {
        bVar1 = height < 3;
      }
      src_stride = (this->super_Filter).in_vi.Height;
      src_ptr._4_4_ = (this->super_Filter).in_vi.Width;
      src_stride_00 = *(int *)((long)src.SrcPointers + (long)height * 4);
      src_ptr_00 = *(uchar **)(src._0_8_ + (long)height * 8);
      if (bVar1) {
        src_stride = src_stride >> ((byte)(this->super_Filter).in_vi.Format.SSH & 0x1f);
        src_ptr._4_4_ = src_ptr._4_4_ >> ((byte)(this->super_Filter).in_vi.Format.SSW & 0x1f);
      }
      if (this->process[height] == 2) {
        framecpy(this,__return_storage_ptr__->DstPointers[height],
                 __return_storage_ptr__->StrideBytes[height],src_ptr_00,src_stride_00,
                 src_ptr._4_4_ * (this->super_Filter).in_vi.Format.BytesPerSample,src_stride);
      }
      else if (this->process[height] == 3) {
        (*this->minideen_core)
                  (src_ptr_00,__return_storage_ptr__->DstPointers[height],src_ptr._4_4_,src_stride,
                   src_stride_00,__return_storage_ptr__->StrideBytes[height],this->threshold[height]
                   ,this->radius[height]);
      }
    }
  }
  else {
    DSFrame::DSFrame(__return_storage_ptr__,(DSFrame *)local_100);
  }
  DSFrame::~DSFrame((DSFrame *)local_100);
  return __return_storage_ptr__;
}

Assistant:

DSFrame GetFrame(int n, std::unordered_map<int, DSFrame> in_frames) override
  {
    auto src = in_frames[n];
    if (bypass)
      return src;
    auto dst = src.Create(false);

    for (int p = 0; p < in_vi.Format.Planes; p++)
    {
      bool chroma = in_vi.Format.IsFamilyYUV && p > 0 && p < 3;
      auto height = in_vi.Height;
      auto width = in_vi.Width;
      auto src_stride = src.StrideBytes[p];
      auto src_ptr = src.SrcPointers[p];
      auto dst_stride = dst.StrideBytes[p];
      auto dst_ptr = dst.DstPointers[p];

      if (chroma) {
        height >>= in_vi.Format.SSH;
        width >>= in_vi.Format.SSW;
      }

      if (process[p] == 2) {
        framecpy(dst_ptr, dst_stride, src_ptr, src_stride, width * in_vi.Format.BytesPerSample, height);
        continue;
      }
      if (process[p] != 3)
        continue;

      minideen_core(src_ptr, dst_ptr, width, height, src_stride, dst_stride, threshold[p], radius[p]);
    }

    return dst;
  }